

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O2

cell_index_t itree_find(itree_t *t,cell_index_t *end,cell_index_t start,cell_id_t id)

{
  cell_t *pcVar1;
  cell_index_t cVar2;
  uint uVar3;
  
  pcVar1 = t->cell;
  if (pcVar1[start].id == 0xffffffff) {
    cVar2 = 0xffffffff;
  }
  else {
    cVar2 = start;
    start = 0xffffffff;
    while ((uVar3 = cVar2, cVar2 = 0xffffffff, uVar3 != 0xffffffff &&
           (cVar2 = uVar3, pcVar1[uVar3].id != id))) {
      cVar2 = pcVar1[uVar3].sib;
      start = uVar3;
    }
  }
  *end = start;
  return cVar2;
}

Assistant:

cell_index_t itree_find(itree_t *t,
			cell_index_t *end,
			cell_index_t start,
			cell_id_t id)
{
    cell_t *cell;
    cell_index_t i, l = NO_ID, o;
    
    cell = t->cell;

    if (cell[start].id != NO_ID) {
	for (i = start; (i != NO_ID) && (cell[i].id != id); i = cell[i].sib)
	    l = i;

	if (i != NO_ID)
	    o = i;
	else 
	    o = NULL_INDEX;
    }
    else {
	o = NULL_INDEX;
	l = start;
    }

    *end = l;

    return o;
}